

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.cpp
# Opt level: O2

void __thiscall
Iir::BandStopTransform::BandStopTransform
          (BandStopTransform *this,double fc,double fw,LayoutBase *digital,LayoutBase *analog)

{
  uint uVar1;
  int pairIndex;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  int iVar3;
  int pairIndex_00;
  double dVar4;
  double dVar5;
  complex_t c;
  complex_t c_00;
  complex_t c_01;
  complex_t c_02;
  ComplexPair zeros;
  ComplexPair p;
  undefined8 extraout_RDX_00;
  
  this->a2 = 0.0;
  this->b2 = 0.0;
  this->a = 0.0;
  this->b = 0.0;
  this->wc = 0.0;
  this->wc2 = 0.0;
  if (0.5 <= fc) {
    throw_invalid_argument("The cutoff frequency needs to be below the Nyquist frequency.");
  }
  if (fc < 0.0) {
    throw_invalid_argument("Cutoff frequency is negative.");
  }
  digital->m_numPoles = 0;
  dVar4 = fc * 6.283185307179586 + fw * 6.283185307179586 * -0.5;
  this->wc2 = dVar4;
  dVar5 = fw * 6.283185307179586 + dVar4;
  this->wc = dVar5;
  if (dVar4 < 1e-08) {
    this->wc2 = 1e-08;
    dVar4 = 1e-08;
  }
  if (3.141592643589793 < dVar5) {
    this->wc = 3.141592643589793;
    dVar5 = 3.141592643589793;
  }
  dVar4 = cos((dVar5 + dVar4) * 0.5);
  dVar5 = cos((this->wc - this->wc2) * 0.5);
  this->a = dVar4 / dVar5;
  dVar4 = tan((this->wc - this->wc2) * 0.5);
  this->b = dVar4;
  this->a2 = this->a * this->a;
  this->b2 = dVar4 * dVar4;
  uVar1 = analog->m_numPoles;
  uVar2 = 2;
  pairIndex = (int)uVar1 / 2;
  pairIndex_00 = 0;
  iVar3 = pairIndex;
  if (pairIndex < 1) {
    iVar3 = 0;
  }
  for (; iVar3 != pairIndex_00; pairIndex_00 = pairIndex_00 + 1) {
    LayoutBase::getPair(analog,pairIndex_00);
    c._M_value._8_8_ = uVar2;
    c._M_value._0_8_ = extraout_RDX;
    transform(&p,this,c);
    c_00._M_value._8_8_ = uVar2;
    c_00._M_value._0_8_ = extraout_RDX_00;
    transform(&zeros,this,c_00);
    if (((double)zeros.super_complex_pair_t.second._M_value._0_8_ ==
         (double)zeros.super_complex_pair_t.first._M_value._0_8_) &&
       (!NAN((double)zeros.super_complex_pair_t.second._M_value._0_8_) &&
        !NAN((double)zeros.super_complex_pair_t.first._M_value._0_8_))) {
      if (((double)zeros.super_complex_pair_t.second._M_value._8_8_ ==
           (double)zeros.super_complex_pair_t.first._M_value._8_8_) &&
         (!NAN((double)zeros.super_complex_pair_t.second._M_value._8_8_) &&
          !NAN((double)zeros.super_complex_pair_t.first._M_value._8_8_))) {
        zeros.super_complex_pair_t.second._M_value._8_8_ =
             zeros.super_complex_pair_t.first._M_value._8_8_ ^ 0x8000000000000000;
        zeros.super_complex_pair_t.second._M_value._0_8_ =
             zeros.super_complex_pair_t.first._M_value._0_8_;
      }
    }
    LayoutBase::addPoleZeroConjugatePairs(digital,(complex_t *)&p,(complex_t *)&zeros);
    LayoutBase::addPoleZeroConjugatePairs
              (digital,&p.super_complex_pair_t.second,&zeros.super_complex_pair_t.second);
  }
  if ((uVar1 & 1) != 0) {
    LayoutBase::getPair(analog,pairIndex);
    c_01._M_value._8_8_ = uVar2;
    c_01._M_value._0_8_ = extraout_RDX_01;
    transform(&p,this,c_01);
    LayoutBase::getPair(analog,pairIndex);
    c_02._M_value._8_8_ = uVar2;
    c_02._M_value._0_8_ = extraout_RDX_02;
    transform(&zeros,this,c_02);
    LayoutBase::add(digital,&p,&zeros);
  }
  dVar4 = analog->m_normalGain;
  digital->m_normalW = (double)(-(ulong)(fc < 0.25) & 0x400921fb54442d18);
  digital->m_normalGain = dVar4;
  return;
}

Assistant:

BandStopTransform::BandStopTransform (double fc,
                                      double fw,
                                      LayoutBase& digital,
                                      LayoutBase const& analog)
{
	if (!(fc < 0.5)) throw_invalid_argument(cutoffError);
	if (fc < 0.0) throw_invalid_argument(cutoffNeg);

	digital.reset ();
	
	const double ww = 2 * doublePi * fw;
	
	wc2 = 2 * doublePi * fc - (ww / 2);
	wc  = wc2 + ww;
	
	// this is crap
	if (wc2 < 1e-8)
		wc2 = 1e-8;
	if (wc  > doublePi-1e-8)
		wc  = doublePi-1e-8;
	
	a = cos ((wc + wc2) * .5) /
		cos ((wc - wc2) * .5);
	b = tan ((wc - wc2) * .5);
	a2 = a * a;
	b2 = b * b;
	
	const int numPoles = analog.getNumPoles ();
	const int pairs = numPoles / 2;
	for (int i = 0; i < pairs; ++i)
	{
		const PoleZeroPair& pair = analog[i];
		ComplexPair p  = transform (pair.poles.first);
		ComplexPair z  = transform (pair.zeros.first);
		
		// trick to get the conjugate
		if (z.second == z.first)
			z.second = std::conj (z.first);
		
		digital.addPoleZeroConjugatePairs (p.first, z.first);
		digital.addPoleZeroConjugatePairs (p.second, z.second);
	}
	
	if (numPoles & 1)
	{
		ComplexPair poles = transform (analog[pairs].poles.first);
		ComplexPair zeros = transform (analog[pairs].zeros.first);
		
		digital.add (poles, zeros);
	}
	
	if (fc < 0.25)
		digital.setNormal (doublePi, analog.getNormalGain());
	else
		digital.setNormal (0, analog.getNormalGain());
}